

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::IsDefaultValueJavaDefault(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  uint32 uVar4;
  int iVar5;
  int64 iVar6;
  uint64 uVar7;
  EnumValueDescriptor *this;
  LogMessage *other;
  float fVar8;
  double dVar9;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = field;
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
    iVar3 = FieldDescriptor::default_value_int32(local_18);
    field_local._7_1_ = iVar3 == 0;
    break;
  case CPPTYPE_INT64:
    iVar6 = FieldDescriptor::default_value_int64(local_18);
    field_local._7_1_ = iVar6 == 0;
    break;
  case CPPTYPE_UINT32:
    uVar4 = FieldDescriptor::default_value_uint32(local_18);
    field_local._7_1_ = uVar4 == 0;
    break;
  case CPPTYPE_UINT64:
    uVar7 = FieldDescriptor::default_value_uint64(local_18);
    field_local._7_1_ = uVar7 == 0;
    break;
  case CPPTYPE_DOUBLE:
    dVar9 = FieldDescriptor::default_value_double(local_18);
    field_local._7_1_ = dVar9 == 0.0;
    break;
  case CPPTYPE_FLOAT:
    fVar8 = FieldDescriptor::default_value_float(local_18);
    field_local._7_1_ = fVar8 == 0.0;
    break;
  case CPPTYPE_BOOL:
    bVar1 = FieldDescriptor::default_value_bool(local_18);
    field_local._7_1_ = !bVar1;
    break;
  case CPPTYPE_ENUM:
    this = FieldDescriptor::default_value_enum(local_18);
    iVar5 = EnumValueDescriptor::number(this);
    field_local._7_1_ = iVar5 == 0;
    break;
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
    field_local._7_1_ = false;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1ff);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    field_local._7_1_ = false;
  }
  return field_local._7_1_;
}

Assistant:

bool IsDefaultValueJavaDefault(const FieldDescriptor* field) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0L;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0L;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0.0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0.0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return false;

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}